

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O2

void __thiscall
HFactor::ftranU(HFactor *this,HVector *rhs,double expected_density,
               HighsTimerClock *factor_timer_clock_pointer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer piVar7;
  pointer piVar8;
  pointer piVar9;
  pointer pdVar10;
  pointer piVar11;
  pointer pdVar12;
  int iVar13;
  long lVar14;
  uint factor_clock;
  HighsInt factor_clock_00;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  FactorTimer factor_timer;
  
  FactorTimer::start(&factor_timer,0xb,factor_timer_clock_pointer);
  if (this->update_method == 3) {
    factor_clock_00 = 0xd;
    FactorTimer::start(&factor_timer,0xd,factor_timer_clock_pointer);
    ftranMPF(this,rhs);
  }
  else {
    if (this->update_method != 1) goto LAB_0035660c;
    factor_clock_00 = 0xc;
    FactorTimer::start(&factor_timer,0xc,factor_timer_clock_pointer);
    ftranFT(this,rhs);
  }
  HVectorBase<double>::tight(rhs);
  HVectorBase<double>::pack(rhs);
  FactorTimer::stop(&factor_timer,factor_clock_00,factor_timer_clock_pointer);
LAB_0035660c:
  dVar19 = (double)rhs->count * this->inv_num_row;
  if (((expected_density <= 0.1) && (-1 < rhs->count)) && (dVar19 <= 0.05)) {
    if (5e-06 <= dVar19) {
      if (1e-05 <= dVar19) {
        if (0.0001 <= dVar19) {
          if (0.001 <= dVar19) {
            factor_clock = dVar19 < 0.01 | 0x12;
          }
          else {
            factor_clock = 0x14;
          }
        }
        else {
          factor_clock = 0x15;
        }
      }
      else {
        factor_clock = 0x16;
      }
    }
    else {
      factor_clock = 0x17;
    }
    FactorTimer::start(&factor_timer,factor_clock,factor_timer_clock_pointer);
    solveHyper(this->num_row,
               (this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->u_last_p).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,rhs);
LAB_003568a1:
    FactorTimer::stop(&factor_timer,factor_clock,factor_timer_clock_pointer);
    if (this->update_method == 2) {
      FactorTimer::start(&factor_timer,0x18,factor_timer_clock_pointer);
      ftranPF(this,rhs);
      HVectorBase<double>::tight(rhs);
      HVectorBase<double>::pack(rhs);
      FactorTimer::stop(&factor_timer,0x18,factor_timer_clock_pointer);
    }
    FactorTimer::stop(&factor_timer,0xb,factor_timer_clock_pointer);
    return;
  }
  factor_clock = 0x11;
  if (0.1 <= dVar19) {
    factor_clock = (dVar19 < 0.5) + 0xf;
  }
  FactorTimer::start(&factor_timer,factor_clock,factor_timer_clock_pointer);
  piVar5 = (rhs->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (rhs->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar8 = (this->u_last_p).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar9 = (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar10 = (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar11 = (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar15 = (ulong)((long)(this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl
                         .super__Vector_impl_data._M_finish - (long)piVar11) >> 2;
  pdVar12 = (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar17 = uVar15 & 0xffffffff;
  dVar19 = 0.0;
  uVar18 = 0;
LAB_0035670a:
  lVar14 = 0;
  do {
    iVar13 = (int)uVar17;
    if (iVar13 + (int)lVar14 < 1) {
      rhs->count = (int)uVar18;
      rhs->synthetic_tick =
           dVar19 * 15.0 + (double)(((int)uVar15 - this->num_row) * 10) + rhs->synthetic_tick;
      goto LAB_003568a1;
    }
    iVar1 = piVar11[uVar17 + lVar14 + -1];
    lVar16 = (long)iVar1;
    if (lVar16 != -1) {
      if (1e-14 < ABS(pdVar6[lVar16])) break;
      pdVar6[lVar16] = 0.0;
    }
    lVar14 = lVar14 + -1;
  } while( true );
  dVar20 = pdVar6[lVar16] / pdVar12[uVar17 + lVar14 + -1];
  piVar5[uVar18] = iVar1;
  pdVar6[lVar16] = dVar20;
  iVar1 = piVar7[uVar17 + lVar14 + -1];
  iVar2 = piVar8[uVar17 + lVar14 + -1];
  iVar3 = this->num_row;
  uVar17 = (uVar17 + lVar14) - 1;
  for (lVar16 = (long)iVar1; lVar16 < iVar2; lVar16 = lVar16 + 1) {
    iVar4 = piVar9[lVar16];
    pdVar6[iVar4] = pdVar10[lVar16] * -dVar20 + pdVar6[iVar4];
  }
  dVar20 = (double)(iVar2 - iVar1) + dVar19;
  if (iVar13 + (int)lVar14 <= iVar3) {
    dVar20 = dVar19;
  }
  dVar19 = dVar20;
  uVar18 = (ulong)((int)uVar18 + 1);
  goto LAB_0035670a;
}

Assistant:

void HFactor::ftranU(HVector& rhs, const double expected_density,
                     HighsTimerClock* factor_timer_clock_pointer) const {
  assert(rhs.count >= 0);
  FactorTimer factor_timer;
  factor_timer.start(FactorFtranUpper, factor_timer_clock_pointer);
  // The update part
  if (update_method == kUpdateMethodFt) {
    factor_timer.start(FactorFtranUpperFT, factor_timer_clock_pointer);
    ftranFT(rhs);
    rhs.tight();
    rhs.pack();
    factor_timer.stop(FactorFtranUpperFT, factor_timer_clock_pointer);
  } else if (update_method == kUpdateMethodMpf) {
    assert(!(update_method == kUpdateMethodMpf));
    factor_timer.start(FactorFtranUpperMPF, factor_timer_clock_pointer);
    ftranMPF(rhs);
    rhs.tight();
    rhs.pack();
    factor_timer.stop(FactorFtranUpperMPF, factor_timer_clock_pointer);
  }

  // The regular part
  //
  // Determine style of solve
  const double current_density = 1.0 * rhs.count * inv_num_row;
  const bool sparse_solve = rhs.count < 0 || current_density > kHyperCancel ||
                            expected_density > kHyperFtranU;
  if (sparse_solve) {
    const bool report_ftran_upper_sparse =
        false;  // current_density < kHyperCancel;
    HighsInt use_clock;
    if (current_density < 0.1)
      use_clock = FactorFtranUpperSps2;
    else if (current_density < 0.5)
      use_clock = FactorFtranUpperSps1;
    else
      use_clock = FactorFtranUpperSps0;
    factor_timer.start(use_clock, factor_timer_clock_pointer);
    // Alias to non constant
    double rhs_synthetic_tick = 0;
    // Alias to RHS
    HighsInt* rhs_index = rhs.index.data();
    double* rhs_array = rhs.array.data();
    // Alias to factor U
    const HighsInt* u_start = this->u_start.data();
    const HighsInt* u_end = this->u_last_p.data();
    const HighsInt* u_index = this->u_index.data();
    const double* u_value = this->u_value.data();
    // Local accumulation of RHS count
    HighsInt rhs_count = 0;
    // Transform
    HighsInt u_pivot_count = u_pivot_index.size();
    for (HighsInt i_logic = u_pivot_count - 1; i_logic >= 0; i_logic--) {
      // Skip void
      if (u_pivot_index[i_logic] == -1) continue;
      // Normal part
      const HighsInt pivotRow = u_pivot_index[i_logic];
      double pivot_multiplier = rhs_array[pivotRow];
      if (fabs(pivot_multiplier) > kHighsTiny) {
        pivot_multiplier /= u_pivot_value[i_logic];
        rhs_index[rhs_count++] = pivotRow;
        rhs_array[pivotRow] = pivot_multiplier;
        const HighsInt start = u_start[i_logic];
        const HighsInt end = u_end[i_logic];
        if (i_logic >= num_row) {
          rhs_synthetic_tick += (end - start);
        }
        for (HighsInt k = start; k < end; k++)
          rhs_array[u_index[k]] -= pivot_multiplier * u_value[k];
      } else
        rhs_array[pivotRow] = 0;
    }
    // Save the count
    rhs.count = rhs_count;
    rhs.synthetic_tick +=
        rhs_synthetic_tick * 15 + (u_pivot_count - num_row) * 10;
    factor_timer.stop(use_clock, factor_timer_clock_pointer);
    if (report_ftran_upper_sparse) {
      const double final_density = 1.0 * rhs.count * inv_num_row;
      printf(
          "FactorFtranUpperSps: expected_density = %10.4g; current_density = "
          "%10.4g; final_density = %10.4g\n",
          expected_density, current_density, final_density);
    }
  } else {
    HighsInt use_clock = -1;
    if (current_density < 5e-6)
      use_clock = FactorFtranUpperHyper5;
    else if (current_density < 1e-5)
      use_clock = FactorFtranUpperHyper4;
    else if (current_density < 1e-4)
      use_clock = FactorFtranUpperHyper3;
    else if (current_density < 1e-3)
      use_clock = FactorFtranUpperHyper2;
    else if (current_density < 1e-2)
      use_clock = FactorFtranUpperHyper1;
    else
      use_clock = FactorFtranUpperHyper0;
    factor_timer.start(use_clock, factor_timer_clock_pointer);
    const HighsInt* u_index = this->u_index.data();
    const double* u_value = this->u_value.data();
    solveHyper(num_row, u_pivot_lookup.data(), u_pivot_index.data(),
               u_pivot_value.data(), u_start.data(), u_last_p.data(),
               &u_index[0], &u_value[0], &rhs);
    factor_timer.stop(use_clock, factor_timer_clock_pointer);
  }
  if (update_method == kUpdateMethodPf) {
    assert(!(update_method == kUpdateMethodPf));
    factor_timer.start(FactorFtranUpperPF, factor_timer_clock_pointer);
    ftranPF(rhs);
    rhs.tight();
    rhs.pack();
    factor_timer.stop(FactorFtranUpperPF, factor_timer_clock_pointer);
  }
  factor_timer.stop(FactorFtranUpper, factor_timer_clock_pointer);
}